

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPerror(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  TSourceLoc loc;
  string message;
  
  this->disableEscapeSequences = true;
  iVar1 = scanToken(this,ppToken);
  this->disableEscapeSequences = false;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  loc.column = (ppToken->loc).column;
  loc._20_4_ = *(undefined4 *)&(ppToken->loc).field_0x14;
  loc.name._0_4_ = *(undefined4 *)&(ppToken->loc).name;
  loc.name._4_4_ = *(undefined4 *)((long)&(ppToken->loc).name + 4);
  loc.string = (ppToken->loc).string;
  loc.line = (ppToken->loc).line;
  while ((iVar1 - 0x98U < 9 || ((iVar1 != -1 && (iVar1 != 10))))) {
    std::__cxx11::string::append((char *)&message);
    std::__cxx11::string::append((char *)&message);
    iVar1 = scanToken(this,ppToken);
  }
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3d])
            (this->parseContext,(ulong)(uint)loc.line,message._M_dataplus._M_p);
  (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
            (this->parseContext,&loc,message._M_dataplus._M_p,"#error","");
  std::__cxx11::string::_M_dispose();
  return 10;
}

Assistant:

int TPpContext::CPPerror(TPpToken* ppToken)
{
    disableEscapeSequences = true;
    int token = scanToken(ppToken);
    disableEscapeSequences = false;
    std::string message;
    TSourceLoc loc = ppToken->loc;

    while (token != '\n' && token != EndOfInput) {
        if (token == PpAtomConstInt16 || token == PpAtomConstUint16 ||
            token == PpAtomConstInt   || token == PpAtomConstUint   ||
            token == PpAtomConstInt64 || token == PpAtomConstUint64 ||
            token == PpAtomConstFloat16 ||
            token == PpAtomConstFloat || token == PpAtomConstDouble) {
                message.append(ppToken->name);
        } else if (token == PpAtomIdentifier || token == PpAtomConstString) {
            message.append(ppToken->name);
        } else {
            message.append(atomStrings.getString(token));
        }
        message.append(" ");
        token = scanToken(ppToken);
    }
    parseContext.notifyErrorDirective(loc.line, message.c_str());
    // store this msg into the shader's information log..set the Compile Error flag!!!!
    parseContext.ppError(loc, message.c_str(), "#error", "");

    return '\n';
}